

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

TextureFormat sglr::toTextureFormat(PixelFormat *pixelFmt)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  TestError *this;
  long lVar4;
  
  if (toTextureFormat(tcu::PixelFormat_const&)::pixelFormatMap == '\0') {
    iVar3 = __cxa_guard_acquire();
    if (iVar3 != 0) {
      toTextureFormat::pixelFormatMap[0].pixelFmt = _DAT_005ee4f0;
      toTextureFormat::pixelFormatMap[0].texFmt.order = RGBA;
      toTextureFormat::pixelFormatMap[0].texFmt.type = UNORM_INT8;
      toTextureFormat::pixelFormatMap[1].pixelFmt.redBits = 8;
      toTextureFormat::pixelFormatMap[1].pixelFmt.greenBits = 8;
      toTextureFormat::pixelFormatMap[1].pixelFmt.blueBits = 8;
      toTextureFormat::pixelFormatMap[1].pixelFmt.alphaBits = 0;
      toTextureFormat::pixelFormatMap[1].texFmt.order = RGB;
      toTextureFormat::pixelFormatMap[1].texFmt.type = UNORM_INT8;
      toTextureFormat::pixelFormatMap[2].pixelFmt = _DAT_005d40f0;
      toTextureFormat::pixelFormatMap[2].texFmt.order = RGBA;
      toTextureFormat::pixelFormatMap[2].texFmt.type = UNORM_SHORT_4444;
      toTextureFormat::pixelFormatMap[3].pixelFmt.redBits = 5;
      toTextureFormat::pixelFormatMap[3].pixelFmt.greenBits = 5;
      toTextureFormat::pixelFormatMap[3].pixelFmt.blueBits = 5;
      toTextureFormat::pixelFormatMap[3].pixelFmt.alphaBits = 1;
      toTextureFormat::pixelFormatMap[3].texFmt.order = RGBA;
      toTextureFormat::pixelFormatMap[3].texFmt.type = UNORM_SHORT_5551;
      toTextureFormat::pixelFormatMap[4].pixelFmt = _DAT_005ee540;
      toTextureFormat::pixelFormatMap[4].texFmt.order = RGB;
      toTextureFormat::pixelFormatMap[4].texFmt.type = UNORM_SHORT_565;
      __cxa_guard_release();
    }
  }
  lVar1 = 0;
  do {
    lVar4 = lVar1;
    if (lVar4 + 0x18 == 0x90) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Can\'t map pixel format to texture format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0xb3);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    bVar2 = tcu::PixelFormat::operator==
                      ((PixelFormat *)
                       ((long)&toTextureFormat::pixelFormatMap[0].pixelFmt.redBits + lVar4),pixelFmt
                      );
    lVar1 = lVar4 + 0x18;
  } while (!bVar2);
  return *(TextureFormat *)((long)&toTextureFormat::pixelFormatMap[0].texFmt.order + lVar4);
}

Assistant:

tcu::TextureFormat toTextureFormat (const tcu::PixelFormat& pixelFmt)
{
	static const struct
	{
		tcu::PixelFormat	pixelFmt;
		tcu::TextureFormat	texFmt;
	} pixelFormatMap[] =
	{
		{ tcu::PixelFormat(8,8,8,8),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)			},
		{ tcu::PixelFormat(8,8,8,0),	tcu::TextureFormat(tcu::TextureFormat::RGB,		tcu::TextureFormat::UNORM_INT8)			},
		{ tcu::PixelFormat(4,4,4,4),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_SHORT_4444)	},
		{ tcu::PixelFormat(5,5,5,1),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_SHORT_5551)	},
		{ tcu::PixelFormat(5,6,5,0),	tcu::TextureFormat(tcu::TextureFormat::RGB,		tcu::TextureFormat::UNORM_SHORT_565)	}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pixelFormatMap); ndx++)
	{
		if (pixelFormatMap[ndx].pixelFmt == pixelFmt)
			return pixelFormatMap[ndx].texFmt;
	}

	TCU_FAIL("Can't map pixel format to texture format");
}